

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O0

int Hop_ManCleanup(Hop_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Hop_Obj_t *pHVar3;
  int local_24;
  int nNodesOld;
  int i;
  Hop_Obj_t *pNode;
  Vec_Ptr_t *vObjs;
  Hop_Man_t *p_local;
  
  if (p->fRefCount != 0) {
    iVar1 = Hop_ManNodeNum(p);
    p_00 = Vec_PtrAlloc(100);
    for (local_24 = 0; local_24 < p->nTableSize; local_24 = local_24 + 1) {
      pHVar3 = p->pTable[local_24];
      if ((pHVar3 != (Hop_Obj_t *)0x0) && (iVar2 = Hop_ObjRefs(pHVar3), iVar2 == 0)) {
        Vec_PtrPush(p_00,pHVar3);
      }
    }
    for (local_24 = 0; iVar2 = Vec_PtrSize(p_00), local_24 < iVar2; local_24 = local_24 + 1) {
      pHVar3 = (Hop_Obj_t *)Vec_PtrEntry(p_00,local_24);
      Hop_ObjDelete_rec(p,pHVar3);
    }
    Vec_PtrFree(p_00);
    iVar2 = Hop_ManNodeNum(p);
    return iVar1 - iVar2;
  }
  __assert_fail("p->fRefCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopMan.c"
                ,0x7d,"int Hop_ManCleanup(Hop_Man_t *)");
}

Assistant:

int Hop_ManCleanup( Hop_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Hop_Obj_t * pNode;
    int i, nNodesOld;
    assert( p->fRefCount );
    nNodesOld = Hop_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Hop_ManForEachNode( p, pNode, i )
        if ( Hop_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, vObjs, pNode, i )
        Hop_ObjDelete_rec( p, pNode );
    Vec_PtrFree( vObjs );
    return nNodesOld - Hop_ManNodeNum(p);
}